

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O2

cl_int clEnqueueMemsetINTEL_EMU
                 (cl_command_queue queue,void *dst_ptr,cl_int value,size_t size,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  cl_api_clEnqueueSVMMemFill p_Var1;
  cl_int cVar2;
  cl_uchar pattern;
  
  cVar2 = -0x3b;
  if (((g_pIntercept != (CLIntercept *)0x0) &&
      ((g_pIntercept->m_Config).Emulate_cl_intel_unified_shared_memory == true)) &&
     (p_Var1 = (g_pIntercept->m_Dispatch).clEnqueueSVMMemFill,
     p_Var1 != (cl_api_clEnqueueSVMMemFill)0x0)) {
    pattern = (cl_uchar)value;
    cVar2 = (*p_Var1)(queue,dst_ptr,&pattern,1,size,num_events_in_wait_list,event_wait_list,event);
  }
  return cVar2;
}

Assistant:

cl_int CL_API_CALL clEnqueueMemsetINTEL_EMU(   // Deprecated
    cl_command_queue queue,
    void* dst_ptr,
    cl_int value,
    size_t size,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory &&
        pIntercept->dispatch().clEnqueueSVMMemFill )
    {
        const cl_uchar  pattern = (cl_uchar)value;
        return pIntercept->dispatch().clEnqueueSVMMemFill(
            queue,
            dst_ptr,
            &pattern,
            sizeof(pattern),
            size,
            num_events_in_wait_list,
            event_wait_list,
            event );
    }

    return CL_INVALID_OPERATION;
}